

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O0

void __thiscall
CT::MemContourTracing
          (CT *this,MemMat<unsigned_char> *img,MemMat<int> *img_labels,int x,int y,int i_label,
          bool b_external)

{
  bool bVar1;
  int *piVar2;
  Point_<int> *pt;
  bool local_7d;
  undefined1 local_68 [16];
  bool local_58 [7];
  byte local_51;
  int i_previous_contour_point;
  int iStack_4c;
  bool b_isolated;
  Point2i crd_cur_point;
  Point2i crd_next_point;
  Point2i T;
  Point2i s;
  bool b_external_local;
  int i_label_local;
  int y_local;
  int x_local;
  MemMat<int> *img_labels_local;
  MemMat<unsigned_char> *img_local;
  CT *this_local;
  
  cv::Point_<int>::Point_(&T,x,y);
  cv::Point_<int>::Point_(&crd_next_point);
  cv::Point_<int>::Point_(&crd_cur_point);
  cv::Point_<int>::Point_((Point_<int> *)&i_previous_contour_point);
  piVar2 = MemMat<int>::operator()(img_labels,T.y,T.x);
  *piVar2 = i_label;
  local_51 = 0;
  if (b_external) {
    local_58[0] = true;
    local_58[1] = false;
    local_58[2] = false;
    local_58[3] = false;
  }
  else {
    local_58[0] = true;
    local_58[1] = false;
    local_58[2] = false;
    local_58[3] = false;
  }
  MemTracer((CT *)(local_68 + 8),(MemMat<unsigned_char> *)this,(MemMat<int> *)img,
            (Point2i *)img_labels,&T.x,local_58);
  pt = cv::Point_<int>::operator=(&crd_next_point,(Point_<int> *)(local_68 + 8));
  cv::Point_<int>::operator=(&crd_cur_point,pt);
  if ((local_51 & 1) == 0) {
    do {
      cv::Point_<int>::operator=((Point_<int> *)&i_previous_contour_point,&crd_cur_point);
      piVar2 = MemMat<int>::operator()(img_labels,iStack_4c,i_previous_contour_point);
      *piVar2 = i_label;
      MemTracer((CT *)local_68,(MemMat<unsigned_char> *)this,(MemMat<int> *)img,
                (Point2i *)img_labels,&i_previous_contour_point,local_58);
      cv::Point_<int>::operator=(&crd_cur_point,(Point_<int> *)local_68);
      bVar1 = cv::operator==((Point_<int> *)&i_previous_contour_point,&T);
      local_7d = false;
      if (bVar1) {
        local_7d = cv::operator==(&crd_cur_point,&crd_next_point);
      }
    } while (((local_7d ^ 0xffU) & 1) != 0);
  }
  return;
}

Assistant:

void MemContourTracing(MemMat<unsigned char> &img, MemMat<int> &img_labels, int x, int y, int i_label, bool b_external) {
        cv::Point2i s(x, y), T, crd_next_point, crd_cur_point;

        // The current point is labeled 
        img_labels(s.y, s.x) = i_label;

        bool b_isolated(false);
        int i_previous_contour_point;
        if (b_external)
            i_previous_contour_point = 6;
        else
            i_previous_contour_point = 7;

        // First call to Tracer
        crd_next_point = T = MemTracer(img, img_labels, s, i_previous_contour_point, b_isolated);
        if (b_isolated)
            return;

        do {
            crd_cur_point = crd_next_point;
            img_labels(crd_cur_point.y, crd_cur_point.x) = i_label;
            crd_next_point = MemTracer(img, img_labels, crd_cur_point, i_previous_contour_point, b_isolated);
        } while (!(crd_cur_point == s && crd_next_point == T));
    }